

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddLoad
          (InstructionBuilder *this,uint32_t type_id,uint32_t base_ptr_id,uint32_t alignment)

{
  IRContext *this_00;
  uint32_t res_id;
  Instruction *pIVar1;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  uint local_ac;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_ac;
  local_ac = base_ptr_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  if (alignment != 0) {
    local_ac = 2;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_ac;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    local_88.type = SPV_OPERAND_TYPE_MEMORY_ACCESS;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&operands,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
    init_list_01._M_len = 1;
    init_list_01._M_array = &local_ac;
    local_ac = alignment;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_01);
    local_88.type = SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&operands,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  pIVar1 = (Instruction *)::operator_new(0x70);
  this_00 = this->context_;
  res_id = IRContext::TakeNextId(this_00);
  Instruction::Instruction(pIVar1,this_00,OpLoad,type_id,res_id,&operands);
  local_88._0_8_ = pIVar1;
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_88);
  if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return pIVar1;
}

Assistant:

Instruction* AddLoad(uint32_t type_id, uint32_t base_ptr_id,
                       uint32_t alignment = 0) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {base_ptr_id}});
    if (alignment != 0) {
      operands.push_back(
          {SPV_OPERAND_TYPE_MEMORY_ACCESS,
           {static_cast<uint32_t>(spv::MemoryAccessMask::Aligned)}});
      operands.push_back({SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER, {alignment}});
    }

    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpLoad, type_id,
                        GetContext()->TakeNextId(), operands));
    return AddInstruction(std::move(new_inst));
  }